

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O3

void generate_instances_for_node
               (_vox_array<const__vox_scene_node__*> *stack,_vox_array<_vox_scene_node_> *nodes,
               uint32_t node_index,_vox_array<unsigned_int> *child_id_array,
               _vox_array<ogt_vox_model_*> *model_ptrs,_vox_array<ogt_vox_instance> *instances,
               _vox_suballoc_array *misc_data,_vox_array<ogt_vox_group> *groups,uint32_t group_index
               ,bool generate_keyframes)

{
  _vox_scene_node_type _Var1;
  size_t sVar2;
  _vox_scene_node_ *p_Var3;
  _vox_scene_node_ *p_Var4;
  uint *puVar5;
  size_t sVar6;
  char *__function;
  ulong uVar7;
  ulong uVar8;
  _vox_scene_node_ *node;
  _vox_array<unsigned_int> *local_d8;
  ogt_vox_instance new_instance;
  
  uVar7 = (ulong)node_index;
  if (nodes->count <= uVar7) {
    __function = 
    "const T &_vox_array<_vox_scene_node_>::operator[](size_t) const [T = _vox_scene_node_]";
LAB_00108606:
    __assert_fail("(index < count) && (\"index out of bounds\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0x328,__function);
  }
  p_Var4 = nodes->data + uVar7;
  _Var1 = nodes->data[uVar7].node_type;
  node = p_Var4;
  if (_Var1 == k_nodetype_group) {
    if (stack->count == 0) {
LAB_00108556:
      __assert_fail("(back_offset < count) && (\"can\'t peek back further than the number of elements in an array\")"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                    ,0x2f3,
                    "const T &_vox_array<const _vox_scene_node_ *>::peek_back(size_t) const [T = const _vox_scene_node_ *]"
                   );
    }
    p_Var4 = stack->data[stack->count - 1];
    local_d8 = child_id_array;
    if (p_Var4->node_type != k_nodetype_transform) {
      __assert_fail("(last_transform->node_type == k_nodetype_transform) && (\"expected transform node prior to group node\")"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                    ,0x482,
                    "void generate_instances_for_node(_vox_array<const _vox_scene_node_ *> &, const _vox_array<_vox_scene_node_> &, uint32_t, const _vox_array<uint32_t> &, const _vox_array<ogt_vox_model *> &, _vox_array<ogt_vox_instance> &, _vox_suballoc_array &, _vox_array<ogt_vox_group> &, uint32_t, bool)"
                   );
    }
    sVar2 = groups->count;
    new_instance.model_index = group_index;
    new_instance.transform._0_8_ = *(undefined8 *)((long)&p_Var4->u + 0x100);
    new_instance.transform._8_8_ = *(undefined8 *)((long)&p_Var4->u + 0x108);
    new_instance.transform._16_8_ = *(undefined8 *)((long)&p_Var4->u + 0x110);
    new_instance.transform._24_8_ = *(undefined8 *)((long)&p_Var4->u + 0x118);
    new_instance.transform._32_8_ = *(undefined8 *)((long)&p_Var4->u + 0x120);
    new_instance.transform._40_8_ = *(undefined8 *)((long)&p_Var4->u + 0x128);
    new_instance.transform._48_8_ = *(undefined8 *)((long)&p_Var4->u + 0x130);
    new_instance.transform._56_8_ = *(undefined8 *)((long)&p_Var4->u + 0x138);
    new_instance.group_index = CONCAT31(new_instance.group_index._1_3_,(p_Var4->u).transform.hidden)
    ;
    new_instance.layer_index = (p_Var4->u).transform.layer_id;
    new_instance.name = (char *)0x0;
    if ((p_Var4->u).transform.name[0] != '\0') {
      sVar6 = strlen((char *)&p_Var4->u);
      new_instance.name =
           (char *)_vox_suballoc_array::push_back_many<char>
                             (misc_data,(char *)&p_Var4->u,sVar6 + 1,0);
    }
    new_instance.transform_anim.num_keyframes = 0;
    new_instance.transform_anim.keyframes = (ogt_vox_keyframe_transform *)0x0;
    new_instance.transform_anim.loop = false;
    if (generate_keyframes) {
      new_instance.transform_anim.num_keyframes = (p_Var4->u).transform.num_keyframes;
      new_instance.transform_anim.keyframes =
           (ogt_vox_keyframe_transform *)(p_Var4->u).transform.keyframe_offset;
      new_instance.transform_anim.loop = (p_Var4->u).transform.loop;
    }
    _vox_array<ogt_vox_group>::push_back(groups,(ogt_vox_group *)&new_instance);
    _vox_array<const__vox_scene_node__*>::push_back(stack,&node);
    uVar7 = (ulong)(node->u).group.first_child_node_id_index;
    if (local_d8->count <= uVar7) {
      __function = "const T &_vox_array<unsigned int>::operator[](size_t) const [T = unsigned int]";
      goto LAB_00108606;
    }
    if ((node->u).group.num_child_nodes != 0) {
      puVar5 = local_d8->data;
      uVar8 = 0;
      do {
        generate_instances_for_node
                  (stack,nodes,puVar5[uVar7 + uVar8],local_d8,model_ptrs,instances,misc_data,groups,
                   (uint32_t)sVar2,generate_keyframes);
        uVar8 = uVar8 + 1;
      } while (uVar8 < (node->u).group.num_child_nodes);
    }
    if (stack->count == 0) goto LAB_00108575;
    stack->count = stack->count - 1;
  }
  else if (_Var1 == k_nodetype_shape) {
    new_instance.model_index = (p_Var4->u).group.first_child_node_id_index;
    if (model_ptrs->count <= (ulong)new_instance.model_index) {
      __assert_fail("(node->u.shape.model_id < model_ptrs.size()) && (\"unexpected model id for shape node\")"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                    ,0x4a2,
                    "void generate_instances_for_node(_vox_array<const _vox_scene_node_ *> &, const _vox_array<_vox_scene_node_> &, uint32_t, const _vox_array<uint32_t> &, const _vox_array<ogt_vox_model *> &, _vox_array<ogt_vox_instance> &, _vox_suballoc_array &, _vox_array<ogt_vox_group> &, uint32_t, bool)"
                   );
    }
    if (model_ptrs->data[new_instance.model_index] != (ogt_vox_model *)0x0) {
      sVar2 = stack->count;
      if ((sVar2 == 0) || (sVar2 == 1)) goto LAB_00108556;
      p_Var3 = stack->data[sVar2 - 1];
      if (p_Var3->node_type != k_nodetype_transform) {
        __assert_fail("(last_transform->node_type == k_nodetype_transform) && (\"parent node type to a shape node must be a transform node\")"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                      ,0x4a9,
                      "void generate_instances_for_node(_vox_array<const _vox_scene_node_ *> &, const _vox_array<_vox_scene_node_> &, uint32_t, const _vox_array<uint32_t> &, const _vox_array<ogt_vox_model *> &, _vox_array<ogt_vox_instance> &, _vox_suballoc_array &, _vox_array<ogt_vox_group> &, uint32_t, bool)"
                     );
      }
      if (stack->data[sVar2 - 2]->node_type != k_nodetype_group) {
        __assert_fail("(last_group->node_type == k_nodetype_group) && (\"grandparent node type to a shape node must be a group node\")"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                      ,0x4aa,
                      "void generate_instances_for_node(_vox_array<const _vox_scene_node_ *> &, const _vox_array<_vox_scene_node_> &, uint32_t, const _vox_array<uint32_t> &, const _vox_array<ogt_vox_model *> &, _vox_array<ogt_vox_instance> &, _vox_suballoc_array &, _vox_array<ogt_vox_group> &, uint32_t, bool)"
                     );
      }
      new_instance.transform._0_8_ = *(undefined8 *)((long)&p_Var3->u + 0x100);
      new_instance.transform._8_8_ = *(undefined8 *)((long)&p_Var3->u + 0x108);
      new_instance.transform._16_8_ = *(undefined8 *)((long)&p_Var3->u + 0x110);
      new_instance.transform._24_8_ = *(undefined8 *)((long)&p_Var3->u + 0x118);
      new_instance.transform._32_8_ = *(undefined8 *)((long)&p_Var3->u + 0x120);
      new_instance.transform._40_8_ = *(undefined8 *)((long)&p_Var3->u + 0x128);
      new_instance.transform._48_8_ = *(undefined8 *)((long)&p_Var3->u + 0x130);
      new_instance.transform._56_8_ = *(undefined8 *)((long)&p_Var3->u + 0x138);
      new_instance.layer_index = (p_Var3->u).transform.layer_id;
      new_instance.group_index = group_index;
      new_instance.hidden = (p_Var3->u).transform.hidden;
      new_instance.name = (char *)0x0;
      if ((p_Var3->u).transform.name[0] != '\0') {
        sVar6 = strlen((char *)&p_Var3->u);
        new_instance.name =
             (char *)_vox_suballoc_array::push_back_many<char>
                               (misc_data,(char *)&p_Var3->u,sVar6 + 1,0);
      }
      new_instance.transform_anim.num_keyframes = 0;
      new_instance.transform_anim.keyframes = (ogt_vox_keyframe_transform *)0x0;
      new_instance.transform_anim.loop = false;
      new_instance.model_anim.num_keyframes = 0;
      new_instance.model_anim.keyframes = (ogt_vox_keyframe_model *)0x0;
      new_instance.model_anim.loop = false;
      if (generate_keyframes) {
        new_instance.model_anim.num_keyframes = (p_Var4->u).group.num_child_nodes;
        new_instance.model_anim.keyframes =
             (ogt_vox_keyframe_model *)(p_Var4->u).shape.keyframe_offset;
        new_instance.model_anim.loop = (p_Var4->u).shape.loop;
        new_instance.transform_anim.num_keyframes = (p_Var3->u).transform.num_keyframes;
        new_instance.transform_anim.keyframes =
             (ogt_vox_keyframe_transform *)(p_Var3->u).transform.keyframe_offset;
        new_instance.transform_anim.loop = (p_Var3->u).transform.loop;
      }
      _vox_array<ogt_vox_instance>::push_back(instances,&new_instance);
    }
  }
  else {
    if (_Var1 != k_nodetype_transform) {
      __assert_fail("(0) && (\"unhandled node type\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                    ,0x4cc,
                    "void generate_instances_for_node(_vox_array<const _vox_scene_node_ *> &, const _vox_array<_vox_scene_node_> &, uint32_t, const _vox_array<uint32_t> &, const _vox_array<ogt_vox_model *> &, _vox_array<ogt_vox_instance> &, _vox_suballoc_array &, _vox_array<ogt_vox_group> &, uint32_t, bool)"
                   );
    }
    _vox_array<const__vox_scene_node__*>::push_back(stack,&node);
    generate_instances_for_node
              (stack,nodes,(node->u).transform.child_node_id,child_id_array,model_ptrs,instances,
               misc_data,groups,group_index,generate_keyframes);
    if (stack->count == 0) {
LAB_00108575:
      __assert_fail("(count > 0) && (\"cannot pop_back on empty array\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                    ,0x2ef,
                    "void _vox_array<const _vox_scene_node_ *>::pop_back() [T = const _vox_scene_node_ *]"
                   );
    }
    stack->count = stack->count - 1;
  }
  return;
}

Assistant:

static void generate_instances_for_node(
        _vox_array<const _vox_scene_node_*> & stack, const _vox_array<_vox_scene_node_> & nodes, uint32_t node_index, const _vox_array<uint32_t> & child_id_array, const _vox_array<ogt_vox_model*> & model_ptrs,
        _vox_array<ogt_vox_instance> & instances, _vox_suballoc_array & misc_data, _vox_array<ogt_vox_group>& groups, uint32_t group_index, bool generate_keyframes)
    {
        const _vox_scene_node_* node = &nodes[node_index];
        switch (node->node_type)
        {
            case k_nodetype_transform:
            {
                stack.push_back(node);
                generate_instances_for_node(stack, nodes, node->u.transform.child_node_id, child_id_array, model_ptrs, instances, misc_data, groups, group_index,  generate_keyframes);
                stack.pop_back();
                break;
            }
            case k_nodetype_group:
            {
                // create a new group only if we're generating groups.
                uint32_t next_group_index = 0;
                {
                    const _vox_scene_node_* last_transform = stack.peek_back(0);
                    ogt_assert(last_transform->node_type == k_nodetype_transform, "expected transform node prior to group node");

                    next_group_index = (uint32_t)groups.size();
                    ogt_vox_group group;
                    group.parent_group_index = group_index;
                    group.transform          = last_transform->u.transform.transform;
                    group.hidden             = last_transform->u.transform.hidden;
                    group.layer_index        = last_transform->u.transform.layer_id;
                    group.name               = 0;
                    const char* transform_last_name = last_transform->u.transform.name;
                    if (transform_last_name && transform_last_name[0]) {
                        group.name = (const char*)misc_data.push_string(transform_last_name);
                    }
                    clear_anim_transform(&group.transform_anim);
                    if (generate_keyframes) {
                        group.transform_anim.num_keyframes = last_transform->u.transform.num_keyframes;
                        group.transform_anim.keyframes     = (const ogt_vox_keyframe_transform*)(last_transform->u.transform.keyframe_offset);
                        group.transform_anim.loop          = last_transform->u.transform.loop;
                    }
                    groups.push_back(group);
                }

                stack.push_back(node);
                const uint32_t* child_node_ids = (const uint32_t*)& child_id_array[node->u.group.first_child_node_id_index];
                for (uint32_t i = 0; i < node->u.group.num_child_nodes; i++) {
                    generate_instances_for_node(stack, nodes, child_node_ids[i], child_id_array, model_ptrs, instances, misc_data, groups, next_group_index, generate_keyframes);
                }
                stack.pop_back();
                break;
            }
            case k_nodetype_shape:
            {
                ogt_assert(node->u.shape.model_id < model_ptrs.size(), "unexpected model id for shape node");
                if (node->u.shape.model_id < model_ptrs.size() &&    // model ID is valid
                    model_ptrs[node->u.shape.model_id] != NULL )     // model is non-NULL.
                {
                    const _vox_scene_node_* last_transform = stack.peek_back(0);
                    const _vox_scene_node_* last_group     = stack.peek_back(1);
                    (void)last_group;
                    ogt_assert(last_transform->node_type == k_nodetype_transform, "parent node type to a shape node must be a transform node");
                    ogt_assert(last_group->node_type == k_nodetype_group, "grandparent node type to a shape node must be a group node");

                    ogt_vox_instance new_instance;
                    new_instance.model_index = node->u.shape.model_id;
                    new_instance.transform   = last_transform->u.transform.transform;
                    new_instance.layer_index = last_transform->u.transform.layer_id;
                    new_instance.group_index = group_index;
                    new_instance.hidden      = last_transform->u.transform.hidden;
                    // if we got a transform name, allocate space in misc_data for it and keep track of the index
                    // within string data. This will be patched to a real pointer at the very end.
                    new_instance.name = 0;
                    const char* transform_last_name = last_transform->u.transform.name;
                    if (transform_last_name && transform_last_name[0]) {
                        new_instance.name = (const char*)misc_data.push_string(transform_last_name);
                    }
                    // generate keyframes if necessary.
                    clear_anim_transform(&new_instance.transform_anim);
                    clear_anim_model(&new_instance.model_anim);
                    if (generate_keyframes) {
                        new_instance.model_anim.num_keyframes     = node->u.shape.num_keyframes;
                        new_instance.model_anim.keyframes         = (const ogt_vox_keyframe_model*)(node->u.shape.keyframe_offset);
                        new_instance.model_anim.loop              = node->u.shape.loop;
                        new_instance.transform_anim.num_keyframes = last_transform->u.transform.num_keyframes;
                        new_instance.transform_anim.keyframes     = (const ogt_vox_keyframe_transform*)(last_transform->u.transform.keyframe_offset);
                        new_instance.transform_anim.loop          = last_transform->u.transform.loop;
                    }

                    // create the instance
                    instances.push_back(new_instance);
                }
                break;
            }
            default:
            {
                ogt_assert(0, "unhandled node type");
            }
        }
    }